

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

AActor * P_LineAttack(AActor *t1,DAngle *angle,double distance,DAngle *pitch,int damage,
                     FName *damageType,FName *pufftype,int flags,FTranslatedLineTarget *victim,
                     int *actualdamage)

{
  PClass *p;
  PClassActor *pufftype_00;
  AActor *pAVar1;
  FName local_48;
  FName local_44;
  DAngle local_40;
  DAngle local_38;
  
  local_44 = (FName)pufftype->Index;
  p = PClass::FindClass(&local_44);
  pufftype_00 = dyn_cast<PClassActor>((DObject *)p);
  if (pufftype_00 == (PClassActor *)0x0) {
    if (victim != (FTranslatedLineTarget *)0x0) {
      victim->linetarget = (AActor *)0x0;
      (victim->angleFromSource).Degrees = 0.0;
      *(undefined8 *)&victim->unlinked = 0;
    }
    pAVar1 = (AActor *)0x0;
    Printf("Attempt to spawn unknown actor type \'%s\'\n",
           FName::NameData.NameArray[pufftype->Index].Text);
  }
  else {
    local_38 = (DAngle)angle->Degrees;
    local_40 = (DAngle)pitch->Degrees;
    local_48 = (FName)damageType->Index;
    pAVar1 = P_LineAttack(t1,&local_38,distance,&local_40,damage,&local_48,pufftype_00,flags,victim,
                          actualdamage);
  }
  return pAVar1;
}

Assistant:

AActor *P_LineAttack(AActor *t1, DAngle angle, double distance,
	DAngle pitch, int damage, FName damageType, FName pufftype, int flags, FTranslatedLineTarget *victim, int *actualdamage)
{
	PClassActor *type = PClass::FindActor(pufftype);
	if (type == NULL)
	{
		if (victim != NULL)
		{
			memset(victim, 0, sizeof(*victim));
		}
		Printf("Attempt to spawn unknown actor type '%s'\n", pufftype.GetChars());
		return NULL;
	}
	else
	{
		return P_LineAttack(t1, angle, distance, pitch, damage, damageType, type, flags, victim, actualdamage);
	}
}